

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t client_skip_proxy(archive_read_filter *self,int64_t request)

{
  long lVar1;
  la_int64_t lVar2;
  int64_t after;
  int64_t before;
  int64_t ask;
  int64_t get;
  int64_t total;
  int64_t skip_limit;
  int64_t request_local;
  archive_read_filter *self_local;
  
  if (request < 0) {
    __archive_errx(1,"Negative skip requested.");
  }
  if (request == 0) {
    self_local = (archive_read_filter *)0x0;
  }
  else if ((self->archive->client).skipper == (archive_skip_callback *)0x0) {
    if (((self->archive->client).seeker == (archive_seek_callback *)0x0) || (request < 0x10001)) {
      self_local = (archive_read_filter *)0x0;
    }
    else {
      lVar1 = self->position;
      lVar2 = (*(self->archive->client).seeker)(&self->archive->archive,self->data,request,1);
      if (lVar2 == lVar1 + request) {
        self_local = (archive_read_filter *)(lVar2 - lVar1);
      }
      else {
        self_local = (archive_read_filter *)0xffffffffffffffe2;
      }
    }
  }
  else {
    get = 0;
    skip_limit = request;
    while( true ) {
      before = skip_limit;
      if (0x40000000 < skip_limit) {
        before = 0x40000000;
      }
      lVar2 = (*(self->archive->client).skipper)(&self->archive->archive,self->data,before);
      get = lVar2 + get;
      if (lVar2 == 0) {
        return get;
      }
      if (lVar2 == skip_limit) {
        return get;
      }
      if (skip_limit < lVar2) break;
      skip_limit = skip_limit - lVar2;
    }
    self_local = (archive_read_filter *)0xffffffffffffffe2;
  }
  return (int64_t)self_local;
}

Assistant:

static int64_t
client_skip_proxy(struct archive_read_filter *self, int64_t request)
{
	if (request < 0)
		__archive_errx(1, "Negative skip requested.");
	if (request == 0)
		return 0;

	if (self->archive->client.skipper != NULL) {
		/* Seek requests over 1GiB are broken down into
		 * multiple seeks.  This avoids overflows when the
		 * requests get passed through 32-bit arguments. */
		int64_t skip_limit = (int64_t)1 << 30;
		int64_t total = 0;
		for (;;) {
			int64_t get, ask = request;
			if (ask > skip_limit)
				ask = skip_limit;
			get = (self->archive->client.skipper)
				(&self->archive->archive, self->data, ask);
			total += get;
			if (get == 0 || get == request)
				return (total);
			if (get > request)
				return ARCHIVE_FATAL;
			request -= get;
		}
	} else if (self->archive->client.seeker != NULL
		&& request > 64 * 1024) {
		/* If the client provided a seeker but not a skipper,
		 * we can use the seeker to skip forward.
		 *
		 * Note: This isn't always a good idea.  The client
		 * skipper is allowed to skip by less than requested
		 * if it needs to maintain block alignment.  The
		 * seeker is not allowed to play such games, so using
		 * the seeker here may be a performance loss compared
		 * to just reading and discarding.  That's why we
		 * only do this for skips of over 64k.
		 */
		int64_t before = self->position;
		int64_t after = (self->archive->client.seeker)
		    (&self->archive->archive, self->data, request, SEEK_CUR);
		if (after != before + request)
			return ARCHIVE_FATAL;
		return after - before;
	}
	return 0;
}